

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O1

void pzgeom::TPZQuadraticLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  long lVar2;
  
  dVar1 = *loc->fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = (1.0 - dVar1) * dVar1 * -0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[1] = dVar1 * (dVar1 + 1.0) * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[2] = (1.0 - dVar1) * (dVar1 + 1.0);
  if ((0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    *dphi->fElem = dVar1 + -0.5;
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    dphi->fElem[lVar2] = dVar1 + 0.5;
    if ((0 < lVar2) && (2 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2] = dVar1 * -2.0;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}